

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

void __thiscall Server::process_waiting_for_resolve(Server *this)

{
  DNSResolver *this_00;
  bool bVar1;
  int sockfd;
  pointer ppVar2;
  long lVar3;
  Connection *this_01;
  runtime_error *this_02;
  iterator local_88;
  const_iterator local_80;
  undefined1 local_72;
  allocator local_71;
  string local_70 [48];
  Connection *local_40;
  undefined1 auStack_38 [8];
  sockaddr_in addr;
  iterator iStack_20;
  int forwarding_socket;
  _Self local_18;
  iterator i;
  Server *this_local;
  
  i._M_node = (_List_node_base *)this;
  local_18._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::pair<std::pair<int,_int>,_DNSResolver_*>,_std::allocator<std::pair<std::pair<int,_int>,_DNSResolver_*>_>_>
       ::begin(&this->waitingForResolve);
  while( true ) {
    while( true ) {
      iStack_20 = std::__cxx11::
                  list<std::pair<std::pair<int,_int>,_DNSResolver_*>,_std::allocator<std::pair<std::pair<int,_int>,_DNSResolver_*>_>_>
                  ::end(&this->waitingForResolve);
      bVar1 = std::operator!=(&local_18,&stack0xffffffffffffffe0);
      if (!bVar1) {
        return;
      }
      ppVar2 = std::_List_iterator<std::pair<std::pair<int,_int>,_DNSResolver_*>_>::operator->
                         (&local_18);
      bVar1 = DNSResolver::exchange_data(ppVar2->second,&this->rdfds,&this->wrfds);
      if (bVar1) break;
      ppVar2 = std::_List_iterator<std::pair<std::pair<int,_int>,_DNSResolver_*>_>::operator->
                         (&local_18);
      sockfd = DNSResolver::getfd(ppVar2->second);
      add_fd(this,sockfd);
      std::_List_iterator<std::pair<std::pair<int,_int>,_DNSResolver_*>_>::operator++(&local_18,0);
    }
    addr.sin_zero._4_4_ = socket(2,1,0);
    auStack_38._0_2_ = 0;
    auStack_38._2_2_ = 0;
    auStack_38._4_4_ = 0;
    addr.sin_family = 0;
    addr.sin_port = 0;
    addr.sin_addr.s_addr = 0;
    ppVar2 = std::_List_iterator<std::pair<std::pair<int,_int>,_DNSResolver_*>_>::operator->
                       (&local_18);
    lVar3 = DNSResolver::getaddr(ppVar2->second);
    auStack_38._4_4_ = (in_addr_t)lVar3;
    ppVar2 = std::_List_iterator<std::pair<std::pair<int,_int>,_DNSResolver_*>_>::operator->
                       (&local_18);
    auStack_38._2_2_ = htons((uint16_t)(ppVar2->first).second);
    auStack_38._0_2_ = 2;
    this_01 = (Connection *)operator_new(0x68);
    ppVar2 = std::_List_iterator<std::pair<std::pair<int,_int>,_DNSResolver_*>_>::operator->
                       (&local_18);
    Connection::Connection
              (this_01,(ppVar2->first).first,addr.sin_zero._4_4_,(sockaddr_in *)auStack_38);
    local_40 = this_01;
    std::__cxx11::list<Connection_*,_std::allocator<Connection_*>_>::push_back
              (&this->connections,&local_40);
    bVar1 = add_fd(this,addr.sin_zero._4_4_);
    if (!bVar1) break;
    ppVar2 = std::_List_iterator<std::pair<std::pair<int,_int>,_DNSResolver_*>_>::operator->
                       (&local_18);
    this_00 = ppVar2->second;
    if (this_00 != (DNSResolver *)0x0) {
      DNSResolver::~DNSResolver(this_00);
      operator_delete(this_00);
    }
    local_88._M_node =
         (_List_node_base *)
         std::_List_iterator<std::pair<std::pair<int,_int>,_DNSResolver_*>_>::operator++
                   (&local_18,0);
    std::_List_const_iterator<std::pair<std::pair<int,_int>,_DNSResolver_*>_>::_List_const_iterator
              (&local_80,&local_88);
    std::__cxx11::
    list<std::pair<std::pair<int,_int>,_DNSResolver_*>,_std::allocator<std::pair<std::pair<int,_int>,_DNSResolver_*>_>_>
    ::erase(&this->waitingForResolve,local_80);
  }
  local_72 = 1;
  this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"Socket number out of range for select",&local_71);
  std::runtime_error::runtime_error(this_02,local_70);
  local_72 = 0;
  __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Server::process_waiting_for_resolve() {
    for (auto i = waitingForResolve.begin();i!=waitingForResolve.end();) {
        if (i->second->exchange_data(rdfds, wrfds)) {
            int forwarding_socket = socket(AF_INET, SOCK_STREAM, 0);
            sockaddr_in addr;
            memset(&addr, 0, sizeof(addr));
            addr.sin_addr.s_addr = i->second->getaddr();
            addr.sin_port = htons(i->first.second);
            addr.sin_family = AF_INET;
            connections.push_back(new Connection(i->first.first, forwarding_socket, &addr));
            if (!add_fd(forwarding_socket)) {
                throw std::runtime_error(std::string("Socket number out of range for select"));
            }
            delete(i->second);
            waitingForResolve.erase(i++);
        }else{
            add_fd(i->second->getfd());
            i++;
        }
    }

}